

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O2

int Dashel::getOrCreateSocket(ParameterSet *target)

{
  int iVar1;
  int iVar2;
  string *name;
  DashelException *this;
  int *piVar3;
  IPV4Address remoteAddress;
  string local_50;
  sockaddr_in addr;
  
  iVar1 = ParameterSet::get<int>(target,"sock");
  if (-1 < iVar1) {
    return iVar1;
  }
  iVar1 = socket(2,1,6);
  if (iVar1 < 0) {
    this = (DashelException *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    DashelException::DashelException
              (this,ConnectionFailed,*piVar3,"Cannot create socket.",(Stream *)0x0);
  }
  else {
    name = ParameterSet::get_abi_cxx11_(target,"host");
    iVar2 = ParameterSet::get<int>(target,"port");
    IPV4Address::IPV4Address(&remoteAddress,name,(unsigned_short)iVar2);
    addr.sin_family = 2;
    addr.sin_port = remoteAddress.port << 8 | remoteAddress.port >> 8;
    addr.sin_addr.s_addr =
         remoteAddress.address >> 0x18 | (remoteAddress.address & 0xff0000) >> 8 |
         (remoteAddress.address & 0xff00) << 8 | remoteAddress.address << 0x18;
    iVar2 = connect(iVar1,(sockaddr *)&addr,0x10);
    if (iVar2 == 0) {
      IPV4Address::format_abi_cxx11_(&local_50,&remoteAddress,true);
      ParameterSet::add(target,local_50._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      ParameterSet::erase(target,"connectionPort");
      return iVar1;
    }
    this = (DashelException *)__cxa_allocate_exception(0x20);
    piVar3 = __errno_location();
    DashelException::DashelException
              (this,ConnectionFailed,*piVar3,"Cannot connect to remote host.",(Stream *)0x0);
  }
  __cxa_throw(this,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static int getOrCreateSocket(ParameterSet& target)
	{
		int fd = target.get<int>("sock");
		if (fd < 0)
		{
			// create socket
			fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
			if (fd < 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot create socket.");

			IPV4Address remoteAddress(target.get("host"), target.get<int>("port"));

			// connect
			sockaddr_in addr;
			addr.sin_family = AF_INET;
			addr.sin_port = htons(remoteAddress.port);
			addr.sin_addr.s_addr = htonl(remoteAddress.address);
			if (connect(fd, (struct sockaddr*)&addr, sizeof(addr)) != 0)
				throw DashelException(DashelException::ConnectionFailed, errno, "Cannot connect to remote host.");

			// overwrite target name with a canonical one
			target.add(remoteAddress.format().c_str());
			target.erase("connectionPort");
		}
		return fd;
	}